

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

float double_conversion::Strtof(Vector<const_char> buffer,int exponent)

{
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  float fVar4;
  DiyFp DVar5;
  int comparison;
  float min_float;
  DiyFp upper_boundary;
  float next;
  float guess;
  double double_next2;
  float f4;
  float f3;
  float f2;
  float f1;
  double double_previous;
  double double_next;
  float float_guess;
  bool is_correct;
  double double_guess;
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  undefined1 *d;
  float f;
  Double *in_stack_fffffffffffffb90;
  Double *in_stack_fffffffffffffb98;
  Double *in_stack_fffffffffffffba8;
  double *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined1 local_414 [12];
  int32_t local_408;
  uint64_t local_400;
  int32_t local_3f8;
  Vector<const_char> *in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  uint64_t in_stack_fffffffffffffc30;
  int exponent_00;
  int32_t in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int *in_stack_fffffffffffffc50;
  float local_3a8;
  double local_358;
  undefined1 local_33c [4];
  Vector<const_char> local_338 [45];
  int in_stack_ffffffffffffffa4;
  DiyFp in_stack_ffffffffffffffa8;
  Vector<const_char> in_stack_ffffffffffffffb8;
  float local_4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  exponent_00 = (int)(in_stack_fffffffffffffc30 >> 0x20);
  Vector<const_char>::Vector(local_338);
  d = local_33c;
  buffer_00.start_._4_4_ = in_stack_fffffffffffffc3c;
  buffer_00.start_._0_4_ = in_stack_fffffffffffffc38;
  buffer_00.length_ = in_stack_fffffffffffffc40;
  buffer_00._12_4_ = in_stack_fffffffffffffc44;
  TrimAndCut(buffer_00,exponent_00,
             (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
             in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,in_stack_fffffffffffffc50);
  trimmed_00._8_8_ = in_stack_fffffffffffffbc8;
  trimmed_00.start_ = in_stack_fffffffffffffbc0;
  bVar1 = ComputeGuess(trimmed_00,iVar2,in_stack_fffffffffffffbb0);
  local_4 = SanitizedDoubletof((double)in_stack_fffffffffffffb98);
  if (((double)local_4 != local_358) || (NAN((double)local_4) || NAN(local_358))) {
    Double::Double(in_stack_fffffffffffffb90,(double)d);
    Double::NextDouble(in_stack_fffffffffffffba8);
    Double::Double(in_stack_fffffffffffffb90,(double)d);
    Double::PreviousDouble(in_stack_fffffffffffffb98);
    fVar4 = SanitizedDoubletof((double)in_stack_fffffffffffffb98);
    local_3a8 = SanitizedDoubletof((double)in_stack_fffffffffffffb98);
    if (!bVar1) {
      Double::Double(in_stack_fffffffffffffb90,(double)d);
      Double::NextDouble(in_stack_fffffffffffffba8);
      local_3a8 = SanitizedDoubletof((double)in_stack_fffffffffffffb98);
    }
    if ((fVar4 != local_3a8) || (NAN(fVar4) || NAN(local_3a8))) {
      DiyFp::DiyFp((DiyFp *)&stack0xfffffffffffffc30);
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        in_stack_fffffffffffffb98 = (Double *)local_414;
        Single::Single((Single *)in_stack_fffffffffffffb90,(float)((ulong)d >> 0x20));
        f = (float)((ulong)d >> 0x20);
        DVar5 = Single::UpperBoundary((Single *)in_stack_fffffffffffffb90);
        local_414._4_8_ = DVar5.f_;
        local_408 = DVar5.e_;
      }
      else {
        Double::Double(in_stack_fffffffffffffb90,(double)d);
        f = (float)((ulong)d >> 0x20);
        DVar5 = Double::AsDiyFp(in_stack_fffffffffffffb90);
        local_400 = DVar5.f_;
        local_3f8 = DVar5.e_;
      }
      iVar2 = CompareBufferWithDiyFp
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffffa8);
      local_4 = fVar4;
      if ((-1 < iVar2) && (local_4 = local_3a8, iVar2 < 1)) {
        Single::Single((Single *)in_stack_fffffffffffffb90,f);
        uVar3 = Single::Significand((Single *)in_stack_fffffffffffffb98);
        local_4 = local_3a8;
        if ((uVar3 & 1) == 0) {
          local_4 = fVar4;
        }
      }
    }
  }
  return local_4;
}

Assistant:

float Strtof(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double double_guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &double_guess);

  float float_guess = SanitizedDoubletof(double_guess);
  if (float_guess == double_guess) {
    // This shortcut triggers for integer values.
    return float_guess;
  }

  // We must catch double-rounding. Say the double has been rounded up, and is
  // now a boundary of a float, and rounds up again. This is why we have to
  // look at previous too.
  // Example (in decimal numbers):
  //    input: 12349
  //    high-precision (4 digits): 1235
  //    low-precision (3 digits):
  //       when read from input: 123
  //       when rounded from high precision: 124.
  // To do this we simply look at the neigbors of the correct result and see
  // if they would round to the same float. If the guess is not correct we have
  // to look at four values (since two different doubles could be the correct
  // double).

  double double_next = Double(double_guess).NextDouble();
  double double_previous = Double(double_guess).PreviousDouble();

  float f1 = SanitizedDoubletof(double_previous);
  float f2 = float_guess;
  float f3 = SanitizedDoubletof(double_next);
  float f4;
  if (is_correct) {
    f4 = f3;
  } else {
    double double_next2 = Double(double_next).NextDouble();
    f4 = SanitizedDoubletof(double_next2);
  }
  (void) f2;  // Mark variable as used.
  DOUBLE_CONVERSION_ASSERT(f1 <= f2 && f2 <= f3 && f3 <= f4);

  // If the guess doesn't lie near a single-precision boundary we can simply
  // return its float-value.
  if (f1 == f4) {
    return float_guess;
  }

  DOUBLE_CONVERSION_ASSERT((f1 != f2 && f2 == f3 && f3 == f4) ||
         (f1 == f2 && f2 != f3 && f3 == f4) ||
         (f1 == f2 && f2 == f3 && f3 != f4));

  // guess and next are the two possible candidates (in the same way that
  // double_guess was the lower candidate for a double-precision guess).
  float guess = f1;
  float next = f4;
  DiyFp upper_boundary;
  if (guess == 0.0f) {
    float min_float = 1e-45f;
    upper_boundary = Double(static_cast<double>(min_float) / 2).AsDiyFp();
  } else {
    upper_boundary = Single(guess).UpperBoundary();
  }
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return next;
  } else if ((Single(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return next;
  }
}